

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphListAdd(Nwk_Grf_t *p,int *pList,Nwk_Vrt_t *pVertex)

{
  Nwk_Vrt_t *pNVar1;
  Nwk_Vrt_t *pHead;
  Nwk_Vrt_t *pVertex_local;
  int *pList_local;
  Nwk_Grf_t *p_local;
  
  if (*pList != 0) {
    pNVar1 = p->pVerts[*pList];
    pVertex->iPrev = 0;
    pVertex->iNext = pNVar1->Id;
    pNVar1->iPrev = pVertex->Id;
  }
  *pList = pVertex->Id;
  return;
}

Assistant:

static inline void Nwk_ManGraphListAdd( Nwk_Grf_t * p, int * pList, Nwk_Vrt_t * pVertex )
{
    if ( *pList )
    {
        Nwk_Vrt_t * pHead;
        pHead = p->pVerts[*pList];
        pVertex->iPrev = 0;
        pVertex->iNext = pHead->Id;
        pHead->iPrev = pVertex->Id;
    }
    *pList = pVertex->Id;
}